

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

shared_ptr<phyr::Shape>
phyr::createSphereShape(Transform *o2w,Transform *w2o,bool reverseNormals,double radius)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<phyr::Shape> sVar1;
  bool local_4a;
  undefined1 local_49;
  Sphere *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  double local_30;
  Transform *local_28;
  Transform *local_20;
  
  local_48 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<phyr::Sphere,std::allocator<phyr::Sphere>,phyr::Transform_const*&,phyr::Transform_const*&,double&,bool&>
            (a_Stack_40,&local_48,(allocator<phyr::Sphere> *)&local_49,&local_20,&local_28,&local_30
             ,&local_4a);
  in_RDI->localToWorld = (Transform *)0x0;
  in_RDI->_vptr_Shape = (_func_int **)local_48;
  in_RDI->localToWorld = (Transform *)a_Stack_40[0]._M_pi;
  sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<phyr::Shape>)sVar1.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Shape> createSphereShape(const Transform* o2w,
                                         const Transform* w2o,
                                         bool reverseNormals, Real radius) {
    return std::make_shared<Sphere>(o2w, w2o, radius, reverseNormals);
}